

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_lessequal(lua_State *L,TValue *l,TValue *r)

{
  int iVar1;
  uint uVar2;
  
  if ((l->tt_ == 3) && (r->tt_ == 3)) {
    uVar2 = (uint)((l->value_).n <= (r->value_).n);
  }
  else if (((l->tt_ & 0xfU) == 4) && ((r->tt_ & 0xfU) == 4)) {
    iVar1 = l_strcmp(&((l->value_).gc)->ts,&((r->value_).gc)->ts);
    uVar2 = (uint)(iVar1 < 1);
  }
  else {
    uVar2 = call_orderTM(L,l,r,TM_LE);
    if ((int)uVar2 < 0) {
      iVar1 = call_orderTM(L,r,l,TM_LT);
      if (iVar1 < 0) {
        luaG_ordererror(L,l,r);
      }
      uVar2 = (uint)(iVar1 == 0);
    }
  }
  return uVar2;
}

Assistant:

int luaV_lessequal (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))
    return luai_numle(L, nvalue(l), nvalue(r));
  else if (ttisstring(l) && ttisstring(r))
    return l_strcmp(rawtsvalue(l), rawtsvalue(r)) <= 0;
  else if ((res = call_orderTM(L, l, r, TM_LE)) >= 0)  /* first try `le' */
    return res;
  else if ((res = call_orderTM(L, r, l, TM_LT)) < 0)  /* else try `lt' */
    luaG_ordererror(L, l, r);
  return !res;
}